

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HonokaMiku.cc
# Opt level: O0

int msvcr110_strnicmp(char *first,char *last,size_t count)

{
  bool bVar1;
  uint local_30;
  uint local_2c;
  int l;
  int f;
  size_t count_local;
  char *last_local;
  char *first_local;
  
  _l = count;
  count_local = (size_t)last;
  last_local = first;
  if (count == 0) {
    first_local._4_4_ = 0;
  }
  else {
    do {
      local_2c = (uint)(byte)*last_local;
      if ((0x40 < local_2c) && (local_2c < 0x5b)) {
        local_2c = local_2c + 0x20;
      }
      local_30 = (uint)*(byte *)count_local;
      if ((0x40 < local_30) && (local_30 < 0x5b)) {
        local_30 = local_30 + 0x20;
      }
      _l = _l - 1;
      bVar1 = false;
      if ((_l != 0) && (bVar1 = false, local_2c != 0)) {
        bVar1 = local_2c == local_30;
      }
      count_local = count_local + 1;
      last_local = last_local + 1;
    } while (bVar1);
    first_local._4_4_ = local_2c - local_30;
  }
  return first_local._4_4_;
}

Assistant:

int msvcr110_strnicmp (const char * first, const char * last, size_t count)
{
    if(count)
    {
        int f=0;
        int l=0;

        do
        {
            if ( ((f = (unsigned char)(*(first++))) >= 'A') &&
                    (f <= 'Z') )
                f -= 'A' - 'a';

            if ( ((l = (unsigned char)(*(last++))) >= 'A') &&
                    (l <= 'Z') )
                l -= 'A' - 'a';
        }
        while ( --count && f && (f == l) );

        return ( f - l );
    }
    else
    {
        return 0;
    }
}